

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O0

int run_test_close_order(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  uv_check_init(loop_00,&check_handle);
  uv_check_start(&check_handle,check_cb);
  uv_timer_init(loop_00,&timer_handle1);
  uv_timer_start(&timer_handle1,timer_cb,0);
  uv_timer_init(loop_00,&timer_handle2);
  uv_timer_start(&timer_handle2,timer_cb,100000,0);
  if ((long)check_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x44,"check_cb_called","==","0",(long)check_cb_called,"==",0);
    abort();
  }
  if ((long)close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x45,"close_cb_called","==","0",(long)close_cb_called,"==",0);
    abort();
  }
  if ((long)timer_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x46,"timer_cb_called","==","0",(long)timer_cb_called,"==",0);
    abort();
  }
  uv_run(loop_00,0);
  if ((long)check_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x4a,"1","==","check_cb_called",1,"==",(long)check_cb_called);
    abort();
  }
  if ((long)close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x4b,"3","==","close_cb_called",3,"==",(long)close_cb_called);
    abort();
  }
  if ((long)timer_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x4c,"1","==","timer_cb_called",1,"==",(long)timer_cb_called);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-close-order.c"
            ,0x4e,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(close_order) {
  uv_loop_t* loop;
  loop = uv_default_loop();

  uv_check_init(loop, &check_handle);
  uv_check_start(&check_handle, check_cb);
  uv_timer_init(loop, &timer_handle1);
  uv_timer_start(&timer_handle1, timer_cb, 0, 0);
  uv_timer_init(loop, &timer_handle2);
  uv_timer_start(&timer_handle2, timer_cb, 100000, 0);

  ASSERT_OK(check_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(timer_cb_called);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, check_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_EQ(1, timer_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}